

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int isLikeOrGlob(Parse *pParse,Expr *pExpr,Expr **ppPrefix,int *pisComplete,int *pnoCase)

{
  u32 *puVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  byte bVar5;
  short sVar6;
  undefined2 uVar7;
  sqlite3 *db;
  ExprList *pEVar8;
  Expr *pExpr_00;
  char *z;
  Vdbe *pVVar9;
  char cVar10;
  byte bVar11;
  FuncDef *pFVar12;
  sqlite3_value *pVal;
  byte *pbVar13;
  size_t sVar14;
  Expr *p;
  Op *pOVar15;
  uint uVar16;
  u8 aff;
  byte bVar17;
  uint uVar21;
  int iVar18;
  ulong uVar19;
  Expr *pEVar20;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  double rDummy;
  Token local_40;
  
  if ((pExpr->x).pList == (ExprList *)0x0) {
    return 0;
  }
  db = pParse->db;
  iVar18 = ((pExpr->x).pList)->nExpr;
  pFVar12 = sqlite3FindFunction(db,(pExpr->u).zToken,iVar18,'\x01','\0');
  if (pFVar12 == (FuncDef *)0x0) {
    return 0;
  }
  if ((pFVar12->funcFlags & 4) == 0) {
    return 0;
  }
  pbVar13 = (byte *)pFVar12->pUserData;
  bVar11 = *pbVar13;
  bVar2 = pbVar13[1];
  bVar3 = pbVar13[2];
  uVar23 = 0;
  if (2 < iVar18) {
    pEVar8 = ((pExpr->x).pSelect)->pGroupBy;
    if ((char)pEVar8->nExpr != 'u') {
      return 0;
    }
    pEVar20 = pEVar8->a[0].pExpr;
    bVar5 = pEVar20->op;
    uVar23 = (uint)bVar5;
    if (bVar5 == 0) {
      return 0;
    }
    if (pEVar20->affExpr != '\0') {
      return 0;
    }
    if (bVar5 == bVar11) {
      return 0;
    }
    if (bVar5 == bVar2) {
      return 0;
    }
  }
  *pnoCase = (uint)((pFVar12->funcFlags & 8) == 0);
  for (pEVar20 = ((pExpr->x).pList)->a[0].pExpr; pEVar20 != (Expr *)0x0; pEVar20 = pEVar20->pLeft) {
    if ((pEVar20->flags & 0x2000) == 0) goto LAB_0018ff73;
  }
  pEVar20 = (Expr *)0x0;
LAB_0018ff73:
  pExpr_00 = *(Expr **)((pExpr->x).pList + 1);
  uVar4 = pEVar20->op;
  if (uVar4 == 0x9c) {
    if ((db->flags & 0x800000) != 0) {
LAB_0018ffe8:
      pVal = (sqlite3_value *)0x0;
      iVar18 = 0;
      goto LAB_001902b3;
    }
    sVar6 = pEVar20->iColumn;
    pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar6,aff);
    if ((pVal == (sqlite3_value *)0x0) ||
       (uVar21._0_2_ = pVal->flags, uVar21._2_1_ = pVal->enc, uVar21._3_1_ = pVal->eSubtype,
       (0x4000000040004U >> ((ulong)uVar21 & 0x3f) & 1) == 0)) {
      pbVar13 = (byte *)0x0;
    }
    else {
      pbVar13 = (byte *)sqlite3ValueText(pVal,'\x01');
    }
    uVar21 = 0x80000000;
    if (sVar6 < 0x20) {
      uVar21 = 1 << ((char)sVar6 - 1U & 0x1f);
    }
    puVar1 = &pParse->pVdbe->expmask;
    *puVar1 = *puVar1 | uVar21;
  }
  else {
    if (uVar4 != 'u') goto LAB_0018ffe8;
    pbVar13 = (byte *)(pEVar20->u).zToken;
    pVal = (sqlite3_value *)0x0;
  }
  iVar25 = 0;
  iVar18 = 0;
  if ((((pbVar13 != (byte *)0x0) && (bVar5 = *pbVar13, bVar5 != 0)) &&
      (iVar18 = iVar25, bVar5 != bVar11)) && ((bVar5 != bVar2 && (bVar5 != bVar3)))) {
    uVar21 = 0;
    bVar17 = bVar5;
    do {
      uVar22 = (long)(int)uVar21 + 1;
      if ((bVar17 == (byte)uVar23) && (pbVar13[uVar22] != 0)) {
        uVar22 = (ulong)(uVar21 + 2);
      }
      uVar21 = (uint)uVar22;
      bVar17 = pbVar13[(int)uVar21];
    } while ((((bVar17 != 0) && (bVar17 != bVar11)) && (bVar17 != bVar2)) && (bVar17 != bVar3));
    uVar24 = uVar21;
    if ((1 < (int)uVar21) || ((iVar18 = 0, uVar21 == 1 && (uVar24 = 1, bVar5 != (byte)uVar23)))) {
      if (pbVar13[uVar24 - 1] == 0xff) {
        iVar18 = 0;
      }
      else {
        uVar16 = 0;
        if (bVar17 == bVar11) {
          uVar16 = (uint)(pbVar13[(ulong)uVar24 + 1] == 0);
        }
        *pisComplete = uVar16;
        local_40.z = (char *)pbVar13;
        sVar14 = strlen((char *)pbVar13);
        local_40.n = (uint)sVar14 & 0x3fffffff;
        iVar18 = 0;
        p = sqlite3ExprAlloc(db,0x75,&local_40,0);
        if (p != (Expr *)0x0) {
          z = (p->u).zToken;
          z[(int)uVar21] = '\0';
          uVar22 = 0;
          do {
            cVar10 = z[iVar18];
            z[uVar22] = z[(int)(iVar18 + (uint)((int)cVar10 == uVar23))];
            uVar22 = uVar22 + 1;
            iVar18 = iVar18 + (uint)((int)cVar10 == uVar23) + 1;
          } while (iVar18 < (int)uVar24);
          uVar19 = uVar22 & 0xffffffff;
          z[uVar19] = '\0';
          if (((pExpr_00->op != 0xa7) || (cVar10 = sqlite3ExprAffinity(pExpr_00), cVar10 != 'B')) ||
             (((pExpr_00->flags & 0x3000000) == 0 &&
              (((pExpr_00->y).pTab != (Table *)0x0 && (((pExpr_00->y).pTab)->eTabType == '\x01')))))
             ) {
            iVar18 = sqlite3AtoF(z,(double *)&local_40,(int)uVar22,'\x01');
            if ((0 < iVar18) || ((uVar22 == 1 && (*z == '-')))) {
LAB_00190212:
              sqlite3ExprDeleteNN(db,p);
              sqlite3ValueFree(pVal);
              return 0;
            }
            cVar10 = z[uVar19 - 1];
            z[uVar19 - 1] = cVar10 + '\x01';
            iVar18 = sqlite3AtoF(z,(double *)&local_40,(int)uVar22,'\x01');
            z[uVar19 - 1] = cVar10;
            if (0 < iVar18) goto LAB_00190212;
          }
        }
        *ppPrefix = p;
        iVar18 = 1;
        if (uVar4 == 0x9c) {
          uVar7 = pEVar20->iColumn;
          uVar23 = 0x80000000;
          if ((short)uVar7 < 0x20) {
            uVar23 = 1 << ((char)uVar7 - 1U & 0x1f);
          }
          pVVar9 = pParse->pVdbe;
          pVVar9->expmask = pVVar9->expmask | uVar23;
          if ((*pisComplete != 0) && ((pEVar20->u).zToken[1] != '\0')) {
            if (pParse->nTempReg == '\0') {
              iVar25 = pParse->nMem + 1;
              pParse->nMem = iVar25;
            }
            else {
              bVar11 = pParse->nTempReg - 1;
              pParse->nTempReg = bVar11;
              iVar25 = pParse->aTempReg[bVar11];
            }
            sqlite3ExprCodeTarget(pParse,pEVar20,iVar25);
            if (pVVar9->db->mallocFailed == '\0') {
              pOVar15 = pVVar9->aOp + (long)pVVar9->nOp + -1;
            }
            else {
              pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            }
            pOVar15->p3 = 0;
            if (iVar25 != 0) {
              bVar11 = pParse->nTempReg;
              if ((ulong)bVar11 < 8) {
                pParse->nTempReg = bVar11 + 1;
                pParse->aTempReg[bVar11] = iVar25;
              }
            }
          }
        }
      }
    }
  }
LAB_001902b3:
  sqlite3ValueFree(pVal);
  return iVar18;
}

Assistant:

static int isLikeOrGlob(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* Test this expression */
  Expr **ppPrefix,  /* Pointer to TK_STRING expression with pattern prefix */
  int *pisComplete, /* True if the only wildcard is % in the last character */
  int *pnoCase      /* True if uppercase is equivalent to lowercase */
){
  const u8 *z = 0;           /* String on RHS of LIKE operator */
  Expr *pRight, *pLeft;      /* Right and left size of LIKE operator */
  ExprList *pList;           /* List of operands to the LIKE operator */
  u8 c;                      /* One character in z[] */
  int cnt;                   /* Number of non-wildcard prefix characters */
  u8 wc[4];                  /* Wildcard characters */
  sqlite3 *db = pParse->db;  /* Database connection */
  sqlite3_value *pVal = 0;
  int op;                    /* Opcode of pRight */
  int rc;                    /* Result code to return */

  if( !sqlite3IsLikeFunction(db, pExpr, pnoCase, (char*)wc) ){
    return 0;
  }
#ifdef SQLITE_EBCDIC
  if( *pnoCase ) return 0;
#endif
  assert( ExprUseXList(pExpr) );
  pList = pExpr->x.pList;
  pLeft = pList->a[1].pExpr;

  pRight = sqlite3ExprSkipCollate(pList->a[0].pExpr);
  op = pRight->op;
  if( op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *pReprepare = pParse->pReprepare;
    int iCol = pRight->iColumn;
    pVal = sqlite3VdbeGetBoundValue(pReprepare, iCol, SQLITE_AFF_BLOB);
    if( pVal && sqlite3_value_type(pVal)==SQLITE_TEXT ){
      z = sqlite3_value_text(pVal);
    }
    sqlite3VdbeSetVarmask(pParse->pVdbe, iCol);
    assert( pRight->op==TK_VARIABLE || pRight->op==TK_REGISTER );
  }else if( op==TK_STRING ){
    assert( !ExprHasProperty(pRight, EP_IntValue) );
     z = (u8*)pRight->u.zToken;
  }
  if( z ){

    /* Count the number of prefix characters prior to the first wildcard */
    cnt = 0;
    while( (c=z[cnt])!=0 && c!=wc[0] && c!=wc[1] && c!=wc[2] ){
      cnt++;
      if( c==wc[3] && z[cnt]!=0 ) cnt++;
    }

    /* The optimization is possible only if (1) the pattern does not begin
    ** with a wildcard and if (2) the non-wildcard prefix does not end with
    ** an (illegal 0xff) character, or (3) the pattern does not consist of
    ** a single escape character. The second condition is necessary so
    ** that we can increment the prefix key to find an upper bound for the
    ** range search. The third is because the caller assumes that the pattern
    ** consists of at least one character after all escapes have been
    ** removed.  */
    if( (cnt>1 || (cnt>0 && z[0]!=wc[3])) && 255!=(u8)z[cnt-1] ){
      Expr *pPrefix;

      /* A "complete" match if the pattern ends with "*" or "%" */
      *pisComplete = c==wc[0] && z[cnt+1]==0;

      /* Get the pattern prefix.  Remove all escapes from the prefix. */
      pPrefix = sqlite3Expr(db, TK_STRING, (char*)z);
      if( pPrefix ){
        int iFrom, iTo;
        char *zNew;
        assert( !ExprHasProperty(pPrefix, EP_IntValue) );
        zNew = pPrefix->u.zToken;
        zNew[cnt] = 0;
        for(iFrom=iTo=0; iFrom<cnt; iFrom++){
          if( zNew[iFrom]==wc[3] ) iFrom++;
          zNew[iTo++] = zNew[iFrom];
        }
        zNew[iTo] = 0;
        assert( iTo>0 );

        /* If the LHS is not an ordinary column with TEXT affinity, then the
        ** pattern prefix boundaries (both the start and end boundaries) must
        ** not look like a number.  Otherwise the pattern might be treated as
        ** a number, which will invalidate the LIKE optimization.
        **
        ** Getting this right has been a persistent source of bugs in the
        ** LIKE optimization.  See, for example:
        **    2018-09-10 https://sqlite.org/src/info/c94369cae9b561b1
        **    2019-05-02 https://sqlite.org/src/info/b043a54c3de54b28
        **    2019-06-10 https://sqlite.org/src/info/fd76310a5e843e07
        **    2019-06-14 https://sqlite.org/src/info/ce8717f0885af975
        **    2019-09-03 https://sqlite.org/src/info/0f0428096f17252a
        */
        if( pLeft->op!=TK_COLUMN
         || sqlite3ExprAffinity(pLeft)!=SQLITE_AFF_TEXT
         || (ALWAYS( ExprUseYTab(pLeft) )
             && ALWAYS(pLeft->y.pTab)
             && IsVirtual(pLeft->y.pTab))  /* Might be numeric */
        ){
          int isNum;
          double rDummy;
          isNum = sqlite3AtoF(zNew, &rDummy, iTo, SQLITE_UTF8);
          if( isNum<=0 ){
            if( iTo==1 && zNew[0]=='-' ){
              isNum = +1;
            }else{
              zNew[iTo-1]++;
              isNum = sqlite3AtoF(zNew, &rDummy, iTo, SQLITE_UTF8);
              zNew[iTo-1]--;
            }
          }
          if( isNum>0 ){
            sqlite3ExprDelete(db, pPrefix);
            sqlite3ValueFree(pVal);
            return 0;
          }
        }
      }
      *ppPrefix = pPrefix;

      /* If the RHS pattern is a bound parameter, make arrangements to
      ** reprepare the statement when that parameter is rebound */
      if( op==TK_VARIABLE ){
        Vdbe *v = pParse->pVdbe;
        sqlite3VdbeSetVarmask(v, pRight->iColumn);
        assert( !ExprHasProperty(pRight, EP_IntValue) );
        if( *pisComplete && pRight->u.zToken[1] ){
          /* If the rhs of the LIKE expression is a variable, and the current
          ** value of the variable means there is no need to invoke the LIKE
          ** function, then no OP_Variable will be added to the program.
          ** This causes problems for the sqlite3_bind_parameter_name()
          ** API. To work around them, add a dummy OP_Variable here.
          */
          int r1 = sqlite3GetTempReg(pParse);
          sqlite3ExprCodeTarget(pParse, pRight, r1);
          sqlite3VdbeChangeP3(v, sqlite3VdbeCurrentAddr(v)-1, 0);
          sqlite3ReleaseTempReg(pParse, r1);
        }
      }
    }else{
      z = 0;
    }
  }

  rc = (z!=0);
  sqlite3ValueFree(pVal);
  return rc;
}